

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token __thiscall slang::parsing::Lexer::lexDirective(Lexer *this)

{
  undefined1 in_CL;
  uint uVar1;
  Token TVar2;
  string_view directive_00;
  SyntaxKind directive;
  SyntaxKind local_c;
  
  if (*this->sourceBuffer == '\\') {
    this->sourceBuffer = this->sourceBuffer + 1;
    TVar2 = lexEscapeSequence(this,true);
    return TVar2;
  }
  scanIdentifier(this);
  uVar1 = *(int *)&this->sourceBuffer - (int)this->marker;
  if (uVar1 == 1) {
    TVar2 = create<>(this,Unknown);
    return TVar2;
  }
  if ((ulong)uVar1 != 0) {
    directive_00._M_len = this->marker + 1;
    directive_00._M_str._0_1_ = (this->options).enableLegacyProtect;
    directive_00._M_str._1_7_ = 0;
    local_c = LexerFacts::getDirectiveKind
                        ((LexerFacts *)((ulong)uVar1 - 1),directive_00,(bool)in_CL);
    TVar2 = create<slang::syntax::SyntaxKind&>(this,Directive,&local_c);
    return TVar2;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",1,0);
}

Assistant:

Token Lexer::lexDirective() {
    if (peek() == '\\') {
        // Handle escaped macro names as well.
        advance();
        return lexEscapeSequence(true);
    }

    scanIdentifier();

    // if length is 1, we just have a grave character on its own, which is an error
    if (lexemeLength() == 1) {
        // Error issued in the Preprocessor
        return create(TokenKind::Unknown);
    }

    SyntaxKind directive = LF::getDirectiveKind(lexeme().substr(1), options.enableLegacyProtect);
    return create(TokenKind::Directive, directive);
}